

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<int> __thiscall Omega_h::divide_each_by<int>(Omega_h *this,Read<int> *a,int b)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  size_t sVar2;
  Read<int> RVar3;
  Write<int> c;
  type_conflict f;
  allocator local_69;
  Write<int> local_68;
  type_conflict local_58;
  Write<int> local_30;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_58,"",&local_69);
  Write<int>::Write(&local_68,(LO)(sVar2 >> 2),(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Write<int>::Write(&local_58.c,&local_68);
  Write<int>::Write(&local_58.a.write_,&a->write_);
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  local_58.b = b;
  parallel_for<Omega_h::divide_each_by<int>(Omega_h::Read<int>,int)::_lambda(int)_1_>
            ((LO)(sVar2 >> 2),&local_58,"divide_each_by");
  Write<int>::Write(&local_30,&local_68);
  Read<int>::Read((Read<signed_char> *)this,&local_30);
  Write<int>::~Write(&local_30);
  divide_each_by<int>(Omega_h::Read<int>,int)::{lambda(int)#1}::~Read((_lambda_int__1_ *)&local_58);
  Write<int>::~Write(&local_68);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<T> divide_each_by(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] / b; };
  parallel_for(a.size(), f, "divide_each_by");
  return c;
}